

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter_Symbol_Generator.cc
# Opt level: O2

uint8_t ** __thiscall
Inter_Symbol_Generator::identity_matrix_generate
          (Inter_Symbol_Generator *this,uint32_t row,uint32_t col)

{
  uint8_t **ppuVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (row == col) {
    ppuVar1 = new_matrix(this,row,row);
    for (uVar3 = 0; uVar3 != row; uVar3 = uVar3 + 1) {
      for (uVar4 = 0; row != uVar4; uVar4 = uVar4 + 1) {
        if (uVar3 == uVar4) {
          ppuVar1[uVar3][uVar3] = '\x01';
        }
      }
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"row is not equal to col!");
    std::endl<char,std::char_traits<char>>(poVar2);
    ppuVar1 = (uint8_t **)0x0;
  }
  return ppuVar1;
}

Assistant:

uint8_t** Inter_Symbol_Generator::identity_matrix_generate(uint32_t row, uint32_t col)
{
	uint8_t **matrix;

	if (row != col)
	{
		std::cerr << "row is not equal to col!" << std::endl;
		return NULL;
	}


	matrix = new_matrix(row, col);

	for (int i = 0; i < row; i++)
	{
		for (int j = 0; j < col; j++)
		{
			if (i == j)
			{
				matrix[i][j] = 1;
			}
			
		}
	}

	return matrix;
}